

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_eori_8_ai(void)

{
  uint address;
  uint uVar1;
  uint uVar2;
  uint value;
  
  uVar1 = m68ki_read_imm_8();
  address = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar2 = m68ki_read_8_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
  value = uVar2 ^ uVar1;
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_eori_8_ai(void)
{
	uint src = OPER_I_8();
	uint ea = EA_AY_AI_8();
	uint res = src ^ m68ki_read_8(ea);

	m68ki_write_8(ea, res);

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}